

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# symul.cpp
# Opt level: O0

void __thiscall
symul::symul(symul *this,int *n,float *r,vec2f *boxS,vec2f *iniBox,float speed,float time)

{
  floatingType *pfVar1;
  reference pvVar2;
  undefined8 *in_RCX;
  undefined4 *in_RDX;
  int *in_RSI;
  vector<particle,_std::allocator<particle>_> *in_RDI;
  vec2<float> *in_R8;
  float fVar3;
  float fVar4;
  undefined4 in_XMM1_Da;
  int i;
  anon_class_8_1_8991fb9c randFloat;
  undefined4 in_stack_ffffffffffffff38;
  undefined4 in_stack_ffffffffffffff3c;
  undefined4 in_stack_ffffffffffffff40;
  undefined4 in_stack_ffffffffffffff44;
  undefined4 in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff54;
  size_type in_stack_ffffffffffffff58;
  vector<particle,_std::allocator<particle>_> *in_stack_ffffffffffffff60;
  vector<particle,_std::allocator<particle>_> *this_00;
  vec2<float> local_74;
  vec2<float> local_6c;
  particle local_64;
  int local_54;
  undefined4 local_30;
  vec2<float> *local_28;
  undefined8 *local_20;
  undefined4 *local_18;
  int *local_10;
  
  local_30 = in_XMM1_Da;
  local_28 = in_R8;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  std::allocator<particle>::allocator((allocator<particle> *)0x11a445);
  std::vector<particle,_std::allocator<particle>_>::vector
            (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,
             (allocator_type *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50));
  std::allocator<particle>::~allocator((allocator<particle> *)0x11a468);
  this_00 = in_RDI + 1;
  ::time((time_t *)0x0);
  std::
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  ::mersenne_twister_engine
            ((mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
              *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
             CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
  in_RDI[0xd1].super__Vector_base<particle,_std::allocator<particle>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)*local_20;
  *(undefined4 *)
   &in_RDI[0xd1].super__Vector_base<particle,_std::allocator<particle>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = *local_18;
  *(undefined4 *)
   ((long)&in_RDI[0xd1].super__Vector_base<particle,_std::allocator<particle>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage + 4) = local_30;
  for (local_54 = 0; local_54 < *local_10; local_54 = local_54 + 1) {
    pfVar1 = vec2<float>::getX(local_28);
    fVar3 = symul::anon_class_8_1_8991fb9c::operator()
                      ((anon_class_8_1_8991fb9c *)this_00,(float)((ulong)pfVar1 >> 0x20),
                       SUB84(pfVar1,0));
    vec2<float>::getY(local_28);
    fVar4 = symul::anon_class_8_1_8991fb9c::operator()
                      ((anon_class_8_1_8991fb9c *)this_00,(float)((ulong)pfVar1 >> 0x20),
                       SUB84(pfVar1,0));
    vec2<float>::vec2(&local_6c,fVar3,fVar4);
    fVar3 = symul::anon_class_8_1_8991fb9c::operator()
                      ((anon_class_8_1_8991fb9c *)this_00,(float)((ulong)pfVar1 >> 0x20),
                       SUB84(pfVar1,0));
    fVar4 = symul::anon_class_8_1_8991fb9c::operator()
                      ((anon_class_8_1_8991fb9c *)this_00,(float)((ulong)pfVar1 >> 0x20),
                       SUB84(pfVar1,0));
    vec2<float>::vec2(&local_74,fVar3,fVar4);
    particle::particle(&local_64,&local_6c,&local_74);
    pvVar2 = std::vector<particle,_std::allocator<particle>_>::operator[](in_RDI,(long)local_54);
    pvVar2->position = local_64.position;
    pvVar2->velocity = local_64.velocity;
  }
  return;
}

Assistant:

symul::symul(const int& n, const float& r, const vec2f& boxS, const vec2f& iniBox, float speed, float time)
    : particleR(r), box(boxS), particles(n), timeTick(time), mt_rand(std::time(0))
{
    auto randFloat = [&](float low, float high)
    {
        return low + (high - low) * (static_cast<float>(mt_rand() - mt_rand.min()) / static_cast<float>(mt_rand.max()));
    };
    for(int i = 0; i < n; i++)
        particles[i] = particle(vec2f(randFloat(0 + r, iniBox.getX() - r), randFloat(0 + r, iniBox.getY() - r)),
                                vec2f(randFloat(-speed, speed), randFloat(-speed, speed)));
}